

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resource.cpp
# Opt level: O0

void __thiscall
CampResource_Compare_Test::~CampResource_Compare_Test(CampResource_Compare_Test *this)

{
  CampResource_Compare_Test *this_local;
  
  ~CampResource_Compare_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CampResource, Compare)
{
  Resource h1{Host()};
  Resource h2{Host()};
  Host h; Resource h3{h};

#ifdef CAMP_HAVE_CUDA
  Resource r1{Cuda()};
  Resource r2{Cuda()};
  Cuda s; Resource r3{s};
#endif
#ifdef CAMP_HAVE_HIP
  Resource r1{Hip()};
  Resource r2{Hip()};
  Hip s; Resource r3{s};
#endif
#ifdef CAMP_HAVE_OMP_OFFLOAD
  Resource r1{Omp()};
  Resource r2{Omp()};
  Omp s; Resource r3{s};
#endif

  ASSERT_TRUE(h1 == h1);
  ASSERT_TRUE(h1 == h2);
  
  ASSERT_FALSE(h1 != h2);

#if defined(CAMP_HAVE_CUDA) || \
    defined(CAMP_HAVE_HIP) || \
    defined(CAMP_HAVE_OMP_OFFLOAD)
  ASSERT_TRUE(r1 == r1);
  ASSERT_TRUE(r2 == r2);
  ASSERT_TRUE(s == s);
  ASSERT_TRUE(h == h);
  ASSERT_TRUE(r1 != r2);
  ASSERT_TRUE(r2 != r1);
  ASSERT_TRUE(r1 != h1);
  ASSERT_TRUE(r3 != h3);

  ASSERT_FALSE(r1 == r2);
  ASSERT_FALSE(r2 == r1);
  ASSERT_FALSE(r2 == r3);
  ASSERT_FALSE(h2 == r2);
  ASSERT_FALSE(h3 == r3);
  ASSERT_FALSE(r1 != r1);
#endif
}